

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeCommandListGetContextHandle
          (ze_command_list_handle_t hCommandList,ze_context_handle_t *phContext)

{
  ze_result_t zVar1;
  
  if (DAT_0010d400 != (code *)0x0) {
    zVar1 = (*DAT_0010d400)();
    return zVar1;
  }
  context_t::get()::count = (ze_context_handle_t)((long)context_t::get()::count + 1);
  *phContext = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListGetContextHandle(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_context_handle_t* phContext                  ///< [out] handle of the context on which the command list was created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetContextHandle = context.zeDdiTable.CommandList.pfnGetContextHandle;
        if( nullptr != pfnGetContextHandle )
        {
            result = pfnGetContextHandle( hCommandList, phContext );
        }
        else
        {
            // generic implementation
            *phContext = reinterpret_cast<ze_context_handle_t>( context.get() );

        }

        return result;
    }